

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::fea::ChElementShellReissner4::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChElementShellReissner4 *this,double U,double V)

{
  double dVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ChVector<double> *v;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 in_register_00001208 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 extraout_var [56];
  undefined1 auVar32 [16];
  
  auVar24._8_56_ = in_register_00001248;
  auVar24._0_8_ = V;
  auVar21._8_56_ = in_register_00001208;
  auVar21._0_8_ = U;
  auVar15 = vaddsd_avx512f(auVar24._0_16_,ZEXT816(0x3ff0000000000000));
  dVar7 = auVar15._0_8_ * 0.25;
  dVar8 = auVar15._0_8_ * -0.25;
  auVar15 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar24._0_16_);
  dVar9 = auVar15._0_8_ * -0.25;
  dVar10 = auVar15._0_8_ * 0.25;
  auVar15 = vaddsd_avx512f(auVar21._0_16_,ZEXT816(0x3ff0000000000000));
  dVar11 = auVar15._0_8_ * 0.25;
  auVar16 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar21._0_16_);
  dVar12 = auVar16._0_8_ * 0.25;
  dVar13 = auVar16._0_8_ * -0.25;
  dVar14 = auVar15._0_8_ * -0.25;
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar5 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar6 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar20 = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  dVar1 = *(double *)((long)&peVar4->super_ChNodeFEAbase + 0x20);
  dVar30 = *(double *)((long)&peVar5->super_ChNodeFEAbase + 0x20);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar30;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar9;
  auVar15 = vmulsd_avx512f(auVar33,auVar28);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar7 * dVar20 + dVar1 * dVar8;
  auVar15 = vaddsd_avx512f(auVar36,auVar15);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)&peVar5->field_0x28;
  auVar16 = vmulsd_avx512f(auVar33,auVar38);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(double *)&peVar3->field_0x28 * dVar7 + *(double *)&peVar4->field_0x28 * dVar8;
  auVar16 = vaddsd_avx512f(auVar37,auVar16);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar9;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)&peVar5->field_0x30;
  auVar17 = vmulsd_avx512f(auVar34,auVar39);
  dVar9 = *(double *)((long)&peVar6->super_ChNodeFEAbase + 0x20);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar9;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar10;
  auVar18 = vmulsd_avx512f(auVar19,auVar35);
  auVar18 = vaddsd_avx512f(auVar15,auVar18);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)&peVar6->field_0x28;
  auVar15 = vmulsd_avx512f(auVar19,auVar40);
  auVar19 = vaddsd_avx512f(auVar16,auVar15);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar10;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)&peVar6->field_0x30;
  auVar15 = vmulsd_avx512f(auVar23,auVar41);
  dVar7 = *(double *)&peVar3->field_0x30 * dVar7 + *(double *)&peVar4->field_0x30 * dVar8 +
          auVar17._0_8_ + auVar15._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar13;
  auVar15 = vmulsd_avx512f(auVar16,auVar38);
  auVar16 = vmulsd_avx512f(auVar16,auVar39);
  dVar20 = dVar1 * dVar12 + dVar11 * dVar20 + dVar13 * dVar30 + dVar14 * dVar9;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar14;
  auVar17 = vmulsd_avx512f(auVar31,auVar40);
  dVar1 = *(double *)&peVar4->field_0x28 * dVar12 + dVar11 * *(double *)&peVar3->field_0x28 +
          auVar15._0_8_ + auVar17._0_8_;
  auVar15 = vmulsd_avx512f(auVar31,auVar41);
  dVar30 = dVar11 * *(double *)&peVar3->field_0x30 + *(double *)&peVar4->field_0x30 * dVar12 +
           auVar16._0_8_ + auVar15._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar30;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1 * dVar7;
  auVar16 = vfmsub231sd_fma(auVar29,auVar19,auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar7;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar20;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar18._0_8_ * dVar30;
  auVar15 = vfmsub231sd_fma(auVar32,auVar25,auVar17);
  dVar30 = auVar15._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar19._0_8_ * dVar20;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1;
  auVar17 = vfmsub231sd_fma(auVar26,auVar18,auVar27);
  __return_storage_ptr__->m_data[0] = auVar16._0_8_;
  __return_storage_ptr__->m_data[1] = dVar30;
  __return_storage_ptr__->m_data[2] = auVar17._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar30 * dVar30;
  auVar15 = vfmadd231sd_fma(auVar18,auVar16,auVar16);
  auVar15 = vfmadd231sd_fma(auVar15,auVar17,auVar17);
  if (auVar15._0_8_ < 0.0) {
    auVar22._0_8_ = sqrt(auVar15._0_8_);
    auVar22._8_56_ = extraout_var;
    auVar15 = auVar22._0_16_;
  }
  else {
    auVar15 = vsqrtsd_avx(auVar15,auVar15);
  }
  if (auVar15._0_8_ < 2.2250738585072014e-308) {
    __return_storage_ptr__->m_data[0] = 1.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    dVar20 = 0.0;
  }
  else {
    auVar15 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar15);
    dVar20 = auVar15._0_8_;
    __return_storage_ptr__->m_data[0] = auVar16._0_8_ * dVar20;
    __return_storage_ptr__->m_data[1] = dVar30 * dVar20;
    dVar20 = auVar17._0_8_ * dVar20;
  }
  __return_storage_ptr__->m_data[2] = dVar20;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellReissner4::ComputeNormal(const double U, const double V) {
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeFunctionsDerivativeX(Nx, U, V);
    ShapeFunctionsDerivativeY(Ny, U, V);

    const ChVector<>& pA = m_nodes[0]->GetPos();
    const ChVector<>& pB = m_nodes[1]->GetPos();
    const ChVector<>& pC = m_nodes[2]->GetPos();
    const ChVector<>& pD = m_nodes[3]->GetPos();

    ChVector<> Gx = Nx(0) * pA + Nx(1) * pB + Nx(2) * pC + Nx(3) * pD;
    ChVector<> Gy = Ny(0) * pA + Ny(1) * pB + Ny(2) * pC + Ny(3) * pD;

    ChVector<> mnorm = Vcross(Gx, Gy);
    return mnorm.GetNormalized();
}